

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prediction_scheme_delta_decoder.h
# Opt level: O0

bool __thiscall
draco::PredictionSchemeDeltaDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>::
ComputeOriginalValues
          (PredictionSchemeDeltaDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
           *this,CorrType *in_corr,int *out_data,int size,int num_components,PointIndex *param_6)

{
  undefined1 auVar1 [16];
  int *__p;
  unique_ptr<int[],_std::default_delete<int[]>_> *this_00;
  int in_ECX;
  PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_> *in_RDI;
  int in_R8D;
  int *in_R9;
  int i;
  unique_ptr<int[],_std::default_delete<int[]>_> zero_vals;
  undefined8 in_stack_ffffffffffffff98;
  PredictionSchemeWrapTransformBase<int> *in_stack_ffffffffffffffa0;
  undefined4 local_40;
  int *in_stack_ffffffffffffffc8;
  int *in_stack_ffffffffffffffd0;
  int iVar2;
  
  iVar2 = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>::transform
            (in_RDI);
  PredictionSchemeWrapTransformBase<int>::Init(in_stack_ffffffffffffffa0,iVar2);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)in_R8D;
  __p = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    __p = (int *)0xffffffffffffffff;
  }
  this_00 = (unique_ptr<int[],_std::default_delete<int[]>_> *)operator_new__((ulong)__p);
  memset(this_00,0,(size_t)__p);
  std::unique_ptr<int[],std::default_delete<int[]>>::
  unique_ptr<int*,std::default_delete<int[]>,void,bool>(this_00,__p);
  PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>::transform
            (in_RDI);
  std::unique_ptr<int[],_std::default_delete<int[]>_>::get(this_00);
  local_40 = in_R8D;
  PredictionSchemeWrapDecodingTransform<int,_int>::ComputeOriginalValue
            ((PredictionSchemeWrapDecodingTransform<int,_int> *)CONCAT44(in_ECX,in_R8D),in_R9,
             in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  iVar2 = local_40;
  for (; local_40 < in_ECX; local_40 = iVar2 + local_40) {
    PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>::transform
              (in_RDI);
    PredictionSchemeWrapDecodingTransform<int,_int>::ComputeOriginalValue
              ((PredictionSchemeWrapDecodingTransform<int,_int> *)CONCAT44(in_ECX,iVar2),in_R9,
               in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  std::unique_ptr<int[],_std::default_delete<int[]>_>::~unique_ptr(this_00);
  return true;
}

Assistant:

bool PredictionSchemeDeltaDecoder<DataTypeT, TransformT>::ComputeOriginalValues(
    const CorrType *in_corr, DataTypeT *out_data, int size, int num_components,
    const PointIndex *) {
  this->transform().Init(num_components);
  // Decode the original value for the first element.
  std::unique_ptr<DataTypeT[]> zero_vals(new DataTypeT[num_components]());
  this->transform().ComputeOriginalValue(zero_vals.get(), in_corr, out_data);

  // Decode data from the front using D(i) = D(i) + D(i - 1).
  for (int i = num_components; i < size; i += num_components) {
    this->transform().ComputeOriginalValue(out_data + i - num_components,
                                           in_corr + i, out_data + i);
  }
  return true;
}